

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaf2c.c
# Opt level: O2

void ga_c2fstring(char *cstring,char *fstring,int flength)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  
  sVar3 = strlen(cstring);
  iVar2 = (int)sVar3 - (uint)(cstring[(int)sVar3] == '\n');
  iVar1 = flength;
  if (iVar2 < flength) {
    iVar1 = iVar2;
  }
  if (flength < iVar2) {
    iVar2 = flength;
  }
  for (lVar4 = 0; iVar2 != (int)lVar4; lVar4 = lVar4 + 1) {
    fstring[lVar4] = cstring[lVar4];
  }
  for (lVar5 = 0; flength - iVar1 != (int)lVar5; lVar5 = lVar5 + 1) {
    fstring[lVar4 + lVar5] = ' ';
  }
  return;
}

Assistant:

void ga_c2fstring(char *cstring, char *fstring, int flength)
{
    int clength = strlen(cstring);

    /* remove terminal \n character if any */
    if(cstring[clength] == '\n') {
        clength--;
    }

    /* Truncate C string into Fortran string */
    if (clength > flength) {
        clength = (int)flength;
    }

    /* Copy characters over */
    flength -= clength;
    while (clength--) {
        *fstring++ = *cstring++;
    }

    /* Now terminate with blanks */
    while (flength--) {
        *fstring++ = ' ';
    }
}